

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefParamAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefParamAssignmentSyntax,slang::syntax::NameSyntax&,slang::syntax::EqualsValueClauseSyntax&>
          (BumpAllocator *this,NameSyntax *args,EqualsValueClauseSyntax *args_1)

{
  DefParamAssignmentSyntax *this_00;
  
  this_00 = (DefParamAssignmentSyntax *)allocate(this,0x20,8);
  slang::syntax::DefParamAssignmentSyntax::DefParamAssignmentSyntax(this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }